

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O1

int pk_parse_key_pkcs8_encrypted_der
              (mbedtls_pk_context *pk,uchar *key,size_t keylen,uchar *pwd,size_t pwdlen)

{
  int iVar1;
  uchar *puVar2;
  uchar *p;
  size_t len;
  mbedtls_md_type_t md_alg;
  mbedtls_cipher_type_t cipher_alg;
  mbedtls_asn1_buf pbe_alg_oid;
  mbedtls_asn1_buf pbe_params;
  uchar *local_68;
  size_t local_60;
  mbedtls_md_type_t local_58;
  mbedtls_cipher_type_t local_54;
  mbedtls_asn1_buf local_50;
  mbedtls_asn1_buf local_38;
  
  if (pwdlen == 0) {
    return -0x3c00;
  }
  local_68 = key;
  iVar1 = mbedtls_asn1_get_tag(&local_68,key + keylen,&local_60,0x30);
  if (iVar1 != 0) {
LAB_00118d6e:
    return iVar1 + -0x3d00;
  }
  puVar2 = local_68 + local_60;
  iVar1 = mbedtls_asn1_get_alg(&local_68,puVar2,&local_50,&local_38);
  if ((iVar1 != 0) ||
     (iVar1 = mbedtls_asn1_get_tag(&local_68,puVar2,&local_60,4), puVar2 = local_68, iVar1 != 0))
  goto LAB_00118d6e;
  iVar1 = mbedtls_oid_get_pkcs12_pbe_alg(&local_50,&local_58,&local_54);
  if (iVar1 == 0) {
    iVar1 = mbedtls_pkcs12_pbe(&local_38,0,local_54,local_58,pwd,pwdlen,local_68,local_60,puVar2);
    if (iVar1 == -0x1e00) {
      return -0x3b80;
    }
  }
  else {
    if (local_50.len != 9) {
      if (local_50.len != 10) {
        return -0x3980;
      }
      if ((short)*(long *)((long)local_50.p + 8) != 0x101 ||
          *(long *)local_50.p != 0xc010df78648862a) {
        return -0x3980;
      }
      iVar1 = mbedtls_pkcs12_pbe_sha1_rc4_128(&local_38,0,pwd,pwdlen,local_68,local_60,puVar2);
      if (iVar1 != 0) {
        return iVar1;
      }
      if (*puVar2 != '0') {
        return -0x3b80;
      }
      goto LAB_00118e7e;
    }
    if ((char)*(long *)((long)local_50.p + 8) != '\r' || *(long *)local_50.p != 0x5010df78648862a) {
      return -0x3980;
    }
    iVar1 = mbedtls_pkcs5_pbes2(&local_38,0,pwd,pwdlen,local_68,local_60,puVar2);
    if (iVar1 == -0x2e00) {
      return -0x3b80;
    }
  }
  if (iVar1 != 0) {
    return iVar1;
  }
LAB_00118e7e:
  iVar1 = pk_parse_key_pkcs8_unencrypted_der(pk,puVar2,local_60);
  return iVar1;
}

Assistant:

static int pk_parse_key_pkcs8_encrypted_der(
                                    mbedtls_pk_context *pk,
                                    unsigned char *key, size_t keylen,
                                    const unsigned char *pwd, size_t pwdlen )
{
    int ret, decrypted = 0;
    size_t len;
    unsigned char *buf;
    unsigned char *p, *end;
    mbedtls_asn1_buf pbe_alg_oid, pbe_params;
#if defined(MBEDTLS_PKCS12_C)
    mbedtls_cipher_type_t cipher_alg;
    mbedtls_md_type_t md_alg;
#endif

    p = key;
    end = p + keylen;

    if( pwdlen == 0 )
        return( MBEDTLS_ERR_PK_PASSWORD_REQUIRED );

    /*
     * This function parses the EncryptedPrivateKeyInfo object (PKCS#8)
     *
     *  EncryptedPrivateKeyInfo ::= SEQUENCE {
     *    encryptionAlgorithm  EncryptionAlgorithmIdentifier,
     *    encryptedData        EncryptedData
     *  }
     *
     *  EncryptionAlgorithmIdentifier ::= AlgorithmIdentifier
     *
     *  EncryptedData ::= OCTET STRING
     *
     *  The EncryptedData OCTET STRING is a PKCS#8 PrivateKeyInfo
     *
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    end = p + len;

    if( ( ret = mbedtls_asn1_get_alg( &p, end, &pbe_alg_oid, &pbe_params ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len, MBEDTLS_ASN1_OCTET_STRING ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    buf = p;

    /*
     * Decrypt EncryptedData with appropriate PBE
     */
#if defined(MBEDTLS_PKCS12_C)
    if( mbedtls_oid_get_pkcs12_pbe_alg( &pbe_alg_oid, &md_alg, &cipher_alg ) == 0 )
    {
        if( ( ret = mbedtls_pkcs12_pbe( &pbe_params, MBEDTLS_PKCS12_PBE_DECRYPT,
                                cipher_alg, md_alg,
                                pwd, pwdlen, p, len, buf ) ) != 0 )
        {
            if( ret == MBEDTLS_ERR_PKCS12_PASSWORD_MISMATCH )
                return( MBEDTLS_ERR_PK_PASSWORD_MISMATCH );

            return( ret );
        }

        decrypted = 1;
    }
    else if( MBEDTLS_OID_CMP( MBEDTLS_OID_PKCS12_PBE_SHA1_RC4_128, &pbe_alg_oid ) == 0 )
    {
        if( ( ret = mbedtls_pkcs12_pbe_sha1_rc4_128( &pbe_params,
                                             MBEDTLS_PKCS12_PBE_DECRYPT,
                                             pwd, pwdlen,
                                             p, len, buf ) ) != 0 )
        {
            return( ret );
        }

        // Best guess for password mismatch when using RC4. If first tag is
        // not MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE
        //
        if( *buf != ( MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) )
            return( MBEDTLS_ERR_PK_PASSWORD_MISMATCH );

        decrypted = 1;
    }
    else
#endif /* MBEDTLS_PKCS12_C */
#if defined(MBEDTLS_PKCS5_C)
    if( MBEDTLS_OID_CMP( MBEDTLS_OID_PKCS5_PBES2, &pbe_alg_oid ) == 0 )
    {
        if( ( ret = mbedtls_pkcs5_pbes2( &pbe_params, MBEDTLS_PKCS5_DECRYPT, pwd, pwdlen,
                                  p, len, buf ) ) != 0 )
        {
            if( ret == MBEDTLS_ERR_PKCS5_PASSWORD_MISMATCH )
                return( MBEDTLS_ERR_PK_PASSWORD_MISMATCH );

            return( ret );
        }

        decrypted = 1;
    }
    else
#endif /* MBEDTLS_PKCS5_C */
    {
        ((void) pwd);
    }

    if( decrypted == 0 )
        return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );

    return( pk_parse_key_pkcs8_unencrypted_der( pk, buf, len ) );
}